

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_sra_b_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  ushort uVar5;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  undefined1 in_XMM0_Bp;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar14;
  ushort uVar15;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  undefined1 auVar16 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ushort uVar30;
  char cVar31;
  short sVar40;
  short sVar41;
  short sVar42;
  byte bVar43;
  short sVar44;
  byte bVar46;
  short sVar45;
  short sVar47;
  undefined1 auVar32 [16];
  undefined1 auVar48 [12];
  undefined1 in_XMM4_Bp;
  short sVar52;
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar49 [14];
  undefined1 auVar50 [16];
  
  auVar22 = *(undefined1 (*) [16])&(env->active_fpu).fpr[ws].fd;
  auVar7._0_3_ = (uint3)auVar22[8] << 8;
  auVar7[3] = auVar22[9];
  auVar7[4] = 0;
  auVar7[5] = auVar22[10];
  auVar7[6] = 0;
  auVar7[7] = auVar22[0xb];
  auVar7[8] = 0;
  auVar7[9] = auVar22[0xc];
  auVar7[10] = 0;
  auVar7[0xb] = auVar22[0xd];
  auVar7[0xc] = 0;
  auVar7[0xd] = auVar22[0xe];
  auVar7[0xe] = in_XMM0_Bp;
  auVar7[0xf] = auVar22[0xf];
  auVar32 = psllw((undefined1  [16])(env->active_fpu).fpr[wt],5);
  auVar32 = auVar32 & _DAT_00d835f0;
  bVar43 = auVar32[8];
  bVar46 = auVar32[0xb];
  auVar48._0_10_ = CONCAT19(auVar32[0xc],(unkuint9)bVar46 << 0x38);
  auVar48[10] = 0;
  auVar48[0xb] = auVar32[0xd];
  auVar49[0xc] = 0;
  auVar49._0_12_ = auVar48;
  auVar49[0xd] = auVar32[0xe];
  auVar50[0xe] = in_XMM4_Bp;
  auVar50._0_14_ = auVar49;
  auVar50[0xf] = auVar32[0xf];
  auVar53._0_2_ = -(ushort)((char)bVar43 < '\0');
  auVar53._2_2_ = -(ushort)((char)auVar32[9] < '\0');
  auVar53._4_2_ = -(ushort)((char)auVar32[10] < '\0');
  auVar53._6_2_ = -(ushort)((char)bVar46 < '\0');
  sVar44 = (short)(auVar48._0_10_ >> 0x40);
  auVar53._8_2_ = -(ushort)(sVar44 < 0);
  sVar45 = auVar48._10_2_;
  auVar53._10_2_ = -(ushort)(sVar45 < 0);
  sVar47 = auVar49._12_2_;
  auVar53._12_2_ = -(ushort)(sVar47 < 0);
  sVar52 = auVar50._14_2_;
  auVar53._14_2_ = -(ushort)(sVar52 < 0);
  auVar6 = psraw(auVar7,4);
  auVar7 = auVar6 & auVar53 | ~auVar53 & auVar7;
  sVar40 = (short)(((uint)auVar32[9] << 0x18) >> 0x10);
  sVar41 = (short)(((uint6)auVar32[10] << 0x28) >> 0x20);
  sVar42 = (short)(((ulong)bVar46 << 0x38) >> 0x30);
  auVar54._0_2_ = -(ushort)((short)((ushort)bVar43 << 9) < 0);
  auVar54._2_2_ = -(ushort)((short)(sVar40 * 2) < 0);
  auVar54._4_2_ = -(ushort)((short)(sVar41 * 2) < 0);
  auVar54._6_2_ = -(ushort)((short)(sVar42 * 2) < 0);
  auVar54._8_2_ = -(ushort)((short)(sVar44 * 2) < 0);
  auVar54._10_2_ = -(ushort)((short)(sVar45 * 2) < 0);
  auVar54._12_2_ = -(ushort)((short)(sVar47 * 2) < 0);
  auVar54._14_2_ = -(ushort)((short)(sVar52 * 2) < 0);
  auVar6 = psraw(auVar7,2);
  auVar7 = auVar6 & auVar54 | ~auVar54 & auVar7;
  auVar55._0_2_ = -(ushort)((short)((ushort)bVar43 << 10) < 0);
  auVar55._2_2_ = -(ushort)((short)(sVar40 << 2) < 0);
  auVar55._4_2_ = -(ushort)((short)(sVar41 << 2) < 0);
  auVar55._6_2_ = -(ushort)((short)(sVar42 << 2) < 0);
  auVar55._8_2_ = -(ushort)((short)(sVar44 << 2) < 0);
  auVar55._10_2_ = -(ushort)((short)(sVar45 << 2) < 0);
  auVar55._12_2_ = -(ushort)((short)(sVar47 << 2) < 0);
  auVar55._14_2_ = -(ushort)((short)(sVar52 << 2) < 0);
  auVar6 = psraw(auVar7,1);
  auVar7 = auVar6 & auVar55 | ~auVar55 & auVar7;
  uVar5 = auVar7._0_2_ >> 8;
  uVar8 = auVar7._2_2_ >> 8;
  uVar9 = auVar7._4_2_ >> 8;
  uVar10 = auVar7._6_2_ >> 8;
  uVar11 = auVar7._8_2_ >> 8;
  uVar12 = auVar7._10_2_ >> 8;
  uVar13 = auVar7._12_2_ >> 8;
  uVar14 = auVar7._14_2_ >> 8;
  auVar23._0_14_ = auVar22._0_14_;
  auVar23[0xe] = auVar22[7];
  auVar23[0xf] = auVar22[7];
  auVar21._14_2_ = auVar23._14_2_;
  auVar21._0_13_ = auVar22._0_13_;
  auVar21[0xd] = auVar22[6];
  auVar20._13_3_ = auVar21._13_3_;
  auVar20._0_12_ = auVar22._0_12_;
  auVar20[0xc] = auVar22[6];
  auVar19._12_4_ = auVar20._12_4_;
  auVar19._0_11_ = auVar22._0_11_;
  auVar19[0xb] = auVar22[5];
  auVar18._11_5_ = auVar19._11_5_;
  auVar18._0_10_ = auVar22._0_10_;
  auVar18[10] = auVar22[5];
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_9_ = auVar22._0_9_;
  auVar17[9] = auVar22[4];
  auVar6._9_7_ = auVar17._9_7_;
  auVar6._0_8_ = auVar22._0_8_;
  auVar6[8] = auVar22[4];
  auVar16._8_8_ = auVar6._8_8_;
  auVar16[7] = auVar22[3];
  auVar16[6] = auVar22[3];
  auVar16[5] = auVar22[2];
  auVar16[4] = auVar22[2];
  auVar16[3] = auVar22[1];
  auVar16[2] = auVar22[1];
  auVar16[0] = auVar22[0];
  auVar16[1] = auVar16[0];
  auVar39._0_14_ = auVar32._0_14_;
  auVar39[0xe] = auVar32[7];
  auVar39[0xf] = auVar32[7];
  auVar38._14_2_ = auVar39._14_2_;
  auVar38._0_13_ = auVar32._0_13_;
  auVar38[0xd] = auVar32[6];
  auVar37._13_3_ = auVar38._13_3_;
  auVar37._0_12_ = auVar32._0_12_;
  auVar37[0xc] = auVar32[6];
  auVar36._12_4_ = auVar37._12_4_;
  auVar36._0_11_ = auVar32._0_11_;
  auVar36[0xb] = auVar32[5];
  auVar35._11_5_ = auVar36._11_5_;
  auVar35._0_10_ = auVar32._0_10_;
  auVar35[10] = auVar32[5];
  auVar34._10_6_ = auVar35._10_6_;
  auVar34._0_9_ = auVar32._0_9_;
  auVar34[9] = auVar32[4];
  auVar33._9_7_ = auVar34._9_7_;
  auVar33._0_8_ = auVar32._0_8_;
  auVar33[8] = auVar32[4];
  Var4 = CONCAT91(CONCAT81(auVar33._8_8_,auVar32[3]),auVar32[3]);
  auVar3._2_10_ = Var4;
  auVar3[1] = auVar32[2];
  auVar3[0] = auVar32[2];
  auVar2._2_12_ = auVar3;
  auVar2[1] = auVar32[1];
  auVar2[0] = auVar32[1];
  cVar31 = auVar32[0];
  auVar32._0_2_ = -(ushort)(cVar31 < '\0');
  sVar40 = auVar2._0_2_;
  auVar32._2_2_ = -(ushort)(sVar40 < 0);
  sVar41 = auVar3._0_2_;
  auVar32._4_2_ = -(ushort)(sVar41 < 0);
  sVar42 = (short)Var4;
  auVar32._6_2_ = -(ushort)(sVar42 < 0);
  sVar44 = auVar33._8_2_;
  auVar32._8_2_ = -(ushort)(sVar44 < 0);
  sVar45 = auVar35._10_2_;
  auVar32._10_2_ = -(ushort)(sVar45 < 0);
  sVar47 = auVar37._12_2_;
  auVar32._12_2_ = -(ushort)(sVar47 < 0);
  auVar32._14_2_ = -(ushort)(auVar33._8_8_ < 0);
  auVar22 = psraw(auVar16,4);
  auVar22 = auVar22 & auVar32 | ~auVar32 & auVar16;
  auVar51._0_2_ = -(ushort)((short)(CONCAT11(cVar31,cVar31) * 2) < 0);
  auVar51._2_2_ = -(ushort)((short)(sVar40 * 2) < 0);
  auVar51._4_2_ = -(ushort)((short)(sVar41 * 2) < 0);
  auVar51._6_2_ = -(ushort)((short)(sVar42 * 2) < 0);
  auVar51._8_2_ = -(ushort)((short)(sVar44 * 2) < 0);
  auVar51._10_2_ = -(ushort)((short)(sVar45 * 2) < 0);
  auVar51._12_2_ = -(ushort)((short)(sVar47 * 2) < 0);
  auVar51._14_2_ = -(ushort)((short)(auVar38._14_2_ * 2) < 0);
  auVar6 = psraw(auVar22,2);
  auVar6 = auVar6 & auVar51 | ~auVar51 & auVar22;
  auVar22._0_2_ = -(ushort)((short)(CONCAT11(cVar31,cVar31) << 2) < 0);
  auVar22._2_2_ = -(ushort)((short)(sVar40 << 2) < 0);
  auVar22._4_2_ = -(ushort)((short)(sVar41 << 2) < 0);
  auVar22._6_2_ = -(ushort)((short)(sVar42 << 2) < 0);
  auVar22._8_2_ = -(ushort)((short)(sVar44 << 2) < 0);
  auVar22._10_2_ = -(ushort)((short)(sVar45 << 2) < 0);
  auVar22._12_2_ = -(ushort)((short)(sVar47 << 2) < 0);
  auVar22._14_2_ = -(ushort)((short)(auVar38._14_2_ << 2) < 0);
  auVar23 = psraw(auVar6,1);
  auVar22 = auVar23 & auVar22 | ~auVar22 & auVar6;
  uVar15 = auVar22._0_2_ >> 8;
  uVar24 = auVar22._2_2_ >> 8;
  uVar25 = auVar22._4_2_ >> 8;
  uVar26 = auVar22._6_2_ >> 8;
  uVar27 = auVar22._8_2_ >> 8;
  uVar28 = auVar22._10_2_ >> 8;
  uVar29 = auVar22._12_2_ >> 8;
  uVar30 = auVar22._14_2_ >> 8;
  pfVar1 = (env->active_fpu).fpr + wd;
  *(char *)pfVar1 = (uVar15 != 0) * (uVar15 < 0x100) * auVar22[1] - (0xff < uVar15);
  *(char *)((long)pfVar1 + 1) = (uVar24 != 0) * (uVar24 < 0x100) * auVar22[3] - (0xff < uVar24);
  *(char *)((long)pfVar1 + 2) = (uVar25 != 0) * (uVar25 < 0x100) * auVar22[5] - (0xff < uVar25);
  *(char *)((long)pfVar1 + 3) = (uVar26 != 0) * (uVar26 < 0x100) * auVar22[7] - (0xff < uVar26);
  *(char *)((long)pfVar1 + 4) = (uVar27 != 0) * (uVar27 < 0x100) * auVar22[9] - (0xff < uVar27);
  *(char *)((long)pfVar1 + 5) = (uVar28 != 0) * (uVar28 < 0x100) * auVar22[0xb] - (0xff < uVar28);
  *(char *)((long)pfVar1 + 6) = (uVar29 != 0) * (uVar29 < 0x100) * auVar22[0xd] - (0xff < uVar29);
  *(char *)((long)pfVar1 + 7) = (uVar30 != 0) * (uVar30 < 0x100) * auVar22[0xf] - (0xff < uVar30);
  *(char *)((long)pfVar1 + 8) = (uVar5 != 0) * (uVar5 < 0x100) * auVar7[1] - (0xff < uVar5);
  *(char *)((long)pfVar1 + 9) = (uVar8 != 0) * (uVar8 < 0x100) * auVar7[3] - (0xff < uVar8);
  *(char *)((long)pfVar1 + 10) = (uVar9 != 0) * (uVar9 < 0x100) * auVar7[5] - (0xff < uVar9);
  *(char *)((long)pfVar1 + 0xb) = (uVar10 != 0) * (uVar10 < 0x100) * auVar7[7] - (0xff < uVar10);
  *(char *)((long)pfVar1 + 0xc) = (uVar11 != 0) * (uVar11 < 0x100) * auVar7[9] - (0xff < uVar11);
  *(char *)((long)pfVar1 + 0xd) = (uVar12 != 0) * (uVar12 < 0x100) * auVar7[0xb] - (0xff < uVar12);
  *(char *)((long)pfVar1 + 0xe) = (uVar13 != 0) * (uVar13 < 0x100) * auVar7[0xd] - (0xff < uVar13);
  *(char *)((long)pfVar1 + 0xf) = (uVar14 != 0) * (uVar14 < 0x100) * auVar7[0xf] - (0xff < uVar14);
  return;
}

Assistant:

void helper_msa_sra_b(CPUMIPSState *env,
                      uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_sra_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_sra_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_sra_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_sra_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_sra_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_sra_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_sra_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_sra_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_sra_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_sra_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_sra_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_sra_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_sra_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_sra_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_sra_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_sra_df(DF_BYTE, pws->b[15], pwt->b[15]);
}